

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Maybe<kj::Own<capnp::SchemaFile>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  Path *params_1;
  StringPtr pathText;
  undefined1 auVar1 [16];
  size_t sVar2;
  bool bVar3;
  size_t in_RCX;
  anon_class_24_3_14160855_for_func *func;
  SchemaFile *extraout_RDX;
  String *pSVar4;
  long lVar5;
  DiskSchemaFile *pDVar6;
  Array<kj::String> *this_00;
  DiskSchemaFile *pDVar7;
  Maybe<kj::Own<capnp::SchemaFile>_> MVar8;
  StringPtr path;
  OwnOwn<const_kj::ReadableFile> newFile;
  Path parsed_1;
  Path parsed;
  Own<capnp::SchemaFile::DiskSchemaFile> local_238;
  Own<capnp::SchemaFile::DiskSchemaFile> local_228;
  Own<capnp::SchemaFile> local_218;
  StringPtr *local_208;
  Array<kj::String> local_1f8;
  undefined1 local_1d8 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_1d0;
  StringPtr local_1b8;
  Own<const_kj::ReadableFile> *local_1a8;
  ReadableDirectory **local_1a0;
  long local_198;
  NullableValue<kj::Exception> local_190;
  
  local_1b8.content.ptr = (char *)target.content.size_;
  pDVar6 = (DiskSchemaFile *)target.content.ptr;
  local_1d0.value.content.ptr = (char *)2;
  local_1d8 = (undefined1  [8])(ReadableDirectory **)0x57c7b0;
  local_1b8.content.size_ = in_RCX;
  bVar3 = kj::StringPtr::startsWith(&local_1b8,(StringPtr *)local_1d8);
  if (bVar3) {
    path.content.ptr = local_1b8.content.ptr + 1;
    path.content.size_ = local_1b8.content.size_ - 1;
    kj::Path::parse((Path *)local_1d8,path);
    local_1a8 = (Own<const_kj::ReadableFile> *)&pDVar6->importPath;
    local_1a0 = (pDVar6->importPath).ptr;
    pSVar4 = (String *)(this->super_SchemaFile)._vptr_SchemaFile;
    pDVar7 = (DiskSchemaFile *)this->baseDir;
    local_198 = (pDVar6->importPath).size_ << 3;
    lVar5 = 0;
    do {
      if (local_198 == lVar5) {
        (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
        this->baseDir = (ReadableDirectory *)0x0;
        goto LAB_0044db41;
      }
      params_1 = *(Path **)((long)local_1a0 + lVar5);
      (*(code *)(params_1->parts).ptr[3].content.size_)
                (&local_218,params_1,local_1d8,local_1d0.value.content.ptr);
      local_1f8.ptr = (String *)local_218.disposer;
      local_1f8.size_ = (size_t)local_218.ptr;
      local_218.ptr = (SchemaFile *)0x0;
      kj::Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&local_218);
      sVar2 = local_1f8.size_;
      if ((DiskSchemaFile *)local_1f8.size_ != (DiskSchemaFile *)0x0) {
        local_228.disposer = (Disposer *)0x0;
        kj::
        heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,decltype(nullptr)>
                  ((ReadableDirectory *)&local_238,params_1,
                   (ArrayPtr<const_kj::ReadableDirectory_*const> *)local_1d8,local_1a8,
                   &local_1f8.ptr);
        pDVar7 = local_238.ptr;
        pSVar4 = (String *)local_238.disposer;
        local_238.ptr = (DiskSchemaFile *)0x0;
        local_218.disposer = local_238.disposer;
        local_218.ptr = (SchemaFile *)0x0;
        kj::Own<capnp::SchemaFile>::dispose(&local_218);
        kj::Own<capnp::SchemaFile::DiskSchemaFile>::dispose(&local_238);
      }
      kj::Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&local_1f8);
      lVar5 = lVar5 + 8;
    } while ((DiskSchemaFile *)sVar2 == (DiskSchemaFile *)0x0);
    this->baseDir = (ReadableDirectory *)pDVar7;
    (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)pSVar4;
LAB_0044db41:
    this_00 = (Array<kj::String> *)local_1d8;
  }
  else {
    _local_1d8 = (ArrayPtr<const_kj::String>)kj::Path::parent(&pDVar6->path);
    pathText.content.size_ = local_1b8.content.size_;
    pathText.content.ptr = local_1b8.content.ptr;
    kj::PathPtr::eval((Path *)&local_1f8,(PathPtr *)local_1d8,pathText);
    auVar1[0xf] = 0;
    auVar1._0_15_ = stack0xfffffffffffffe29;
    _local_1d8 = (ArrayPtr<const_kj::String>)(auVar1 << 8);
    if (pDVar6->displayNameOverridden == true) {
      local_218.disposer = (Disposer *)local_1d8;
      local_218.ptr = (SchemaFile *)pDVar6;
      local_208 = &local_1b8;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                ((Maybe<kj::Exception> *)&local_190,(kj *)&local_218,func);
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_190);
    }
    (*(pDVar6->baseDir->super_FsNode)._vptr_FsNode[10])
              (&local_238,pDVar6->baseDir,local_1f8.ptr,local_1f8.size_);
    pDVar7 = local_238.ptr;
    local_218.disposer = local_238.disposer;
    local_218.ptr = &(local_238.ptr)->super_SchemaFile;
    local_238.ptr = (DiskSchemaFile *)0x0;
    kj::Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&local_238);
    if (pDVar7 == (DiskSchemaFile *)0x0) {
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
      this->baseDir = (ReadableDirectory *)0x0;
    }
    else {
      kj::
      heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
                ((kj *)&local_228,pDVar6->baseDir,(Path *)&local_1f8,&pDVar6->importPath,
                 (Own<const_kj::ReadableFile> *)&local_218,(Maybe<kj::String> *)local_1d8);
      pDVar6 = local_228.ptr;
      local_238.disposer = local_228.disposer;
      local_228.ptr = (DiskSchemaFile *)0x0;
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)local_228.disposer;
      this->baseDir = (ReadableDirectory *)pDVar6;
      local_238.ptr = (DiskSchemaFile *)0x0;
      kj::Own<capnp::SchemaFile>::dispose((Own<capnp::SchemaFile> *)&local_238);
      kj::Own<capnp::SchemaFile::DiskSchemaFile>::dispose(&local_228);
    }
    kj::Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&local_218);
    kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_1d8);
    this_00 = &local_1f8;
  }
  kj::Array<kj::String>::~Array(this_00);
  MVar8.ptr.ptr = extraout_RDX;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile>_>)MVar8.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }